

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

Buffer __thiscall nvim::Nvim::create_buf(Nvim *this,bool listed,bool scratch)

{
  Buffer res;
  allocator local_4b;
  bool local_4a;
  bool local_49;
  Buffer local_48;
  string local_40;
  
  local_4a = scratch;
  local_49 = listed;
  std::__cxx11::string::string((string *)&local_40,"nvim_create_buf",&local_4b);
  NvimRPC::call<bool,bool>(&this->client_,&local_40,&local_48,&local_49,&local_4a);
  std::__cxx11::string::~string((string *)&local_40);
  return local_48;
}

Assistant:

Buffer Nvim::create_buf(bool listed, bool scratch) {
    Buffer res;
    client_.call("nvim_create_buf", res, listed, scratch);
    return res;
}